

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

cTValue * lj_meta_cache(GCtab *mt,MMS mm,GCstr *name)

{
  cTValue *pcVar1;
  
  pcVar1 = lj_tab_getstr(mt,name);
  if ((pcVar1 == (cTValue *)0x0) || (pcVar1->u64 == 0xffffffffffffffff)) {
    mt->nomm = mt->nomm | (byte)(1 << ((byte)mm & 0x1f));
    pcVar1 = (cTValue *)0x0;
  }
  return pcVar1;
}

Assistant:

cTValue *lj_meta_cache(GCtab *mt, MMS mm, GCstr *name)
{
  cTValue *mo = lj_tab_getstr(mt, name);
  lj_assertX(mm <= MM_FAST, "bad metamethod %d", mm);
  if (!mo || tvisnil(mo)) {  /* No metamethod? */
    mt->nomm |= (uint8_t)(1u<<mm);  /* Set negative cache flag. */
    return NULL;
  }
  return mo;
}